

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O1

int __thiscall Js::JavascriptBigInt::CompareAbsolute(JavascriptBigInt *this,JavascriptBigInt *pbi)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = this->m_length;
  iVar1 = 1;
  uVar3 = pbi->m_length;
  if (((uVar3 > uVar2 || uVar2 == uVar3) && (iVar1 = -1, uVar3 <= uVar2)) && (iVar1 = 0, uVar2 != 0)
     ) {
    do {
      uVar3 = uVar2 - 1;
      if ((this->m_digits).ptr[uVar2 - 1] != (pbi->m_digits).ptr[uVar2 - 1]) {
        return ((pbi->m_digits).ptr[uVar3] < (this->m_digits).ptr[uVar3]) - 1 | 1;
      }
      uVar2 = uVar3;
    } while (uVar3 != 0);
  }
  return iVar1;
}

Assistant:

int JavascriptBigInt::CompareAbsolute(JavascriptBigInt *pbi)
    {
        digit_t index;

        if (m_length > pbi->m_length)
        {
            return 1;
        }
        if (m_length < pbi->m_length)
        {
            return -1;
        }
        if (0 == m_length)
        {
            return 0;
        }

#pragma prefast(suppress:__WARNING_LOOP_ONLY_EXECUTED_ONCE,"noise")
        for (index = m_length - 1; m_digits[index] == pbi->m_digits[index]; index--)
        {
            if (0 == index)
            {
                return 0;
            }
        }
        Assert(m_digits[index] != pbi->m_digits[index]);

        return (m_digits[index] > pbi->m_digits[index]) ? 1 : -1;
    }